

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test::testBody
          (TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  ulong uVar6;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  uint local_24;
  undefined1 local_20 [4];
  uint value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)local_20,"paramName");
  local_24 = 0x164;
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)local_20,0x164);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_48,pMVar1,local_20);
  pcVar4 = SimpleString::asCharString(local_48);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"unsigned int",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xb9,pTVar5);
  SimpleString::~SimpleString(local_48);
  pUVar3 = UtestShell::getCurrent();
  uVar6 = (ulong)local_24;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,local_20);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_98);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,uVar6,(ulong)uVar2,
             "LONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xba,pTVar5);
  MockNamedValue::~MockNamedValue(&local_98);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,local_20);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 1),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xbb,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_a8);
  pcVar4 = SimpleString::asCharString(&local_a8);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"funcName -> unsigned int paramName: <356 (0x164)>",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xbc);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithUnsignedIntegerParameter)
{
    const SimpleString paramName = "paramName";
    unsigned int value = 356;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("unsigned int", call->getInputParameterType(paramName).asCharString());
    LONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> unsigned int paramName: <356 (0x164)>", call->callToString().asCharString());
}